

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<double,_void_(const_double_&)>::~PromiseDataBase
          (PromiseDataBase<double,_void_(const_double_&)> *this)

{
  PromiseDataBase<double,_void_(const_double_&)> *this_local;
  
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001b72a0;
  PromiseError::~PromiseError(&this->m_error);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  ::~QList(&this->m_catchers);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_double_&)>_>_>::~QList
            (&this->m_handlers);
  QReadWriteLock::~QReadWriteLock(&this->m_lock);
  return;
}

Assistant:

virtual ~PromiseDataBase() { }